

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

string * __thiscall
cppcms::application::url
          (string *__return_storage_ptr__,application *this,string *key,streamable *p1,
          streamable *p2,streamable *p3,streamable *p4,streamable *p5)

{
  undefined1 local_1c0 [24];
  ostringstream ss;
  ios_base local_138 [264];
  
  local_1c0._8_8_ = p3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  context(this);
  http::context::locale((context *)local_1c0);
  std::ios::imbue((locale *)(local_1c0 + 0x10));
  std::locale::~locale((locale *)(local_1c0 + 0x10));
  std::locale::~locale((locale *)local_1c0);
  url_mapper::map((((this->d).ptr_)->url_map).ptr_,(ostream *)&ss,key,p1,p2,
                  (streamable *)local_1c0._8_8_,p4,p5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string application::url(	std::string const &key,
				filters::streamable const &p1,
				filters::streamable const &p2,
				filters::streamable const &p3,
				filters::streamable const &p4,
				filters::streamable const &p5)
{
	std::ostringstream ss;
	ss.imbue(context().locale());
	mapper().map(ss,key,p1,p2,p3,p4,p5);
	return ss.str();
}